

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

UINT32 SignData(TSS_DEVICE *tpm,TSS_SESSION *sess,BYTE *tokenData,UINT32 tokenSize,
               BYTE *signatureBuffer,UINT32 sigBufSize)

{
  bool bVar1;
  UINT16 UVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  _Bool seq_complete;
  LOGGER_LOG l_1;
  BYTE *pBStack_a0;
  UINT32 bytesLeft;
  BYTE *curPos;
  LOGGER_LOG p_Stack_90;
  TPMI_DH_OBJECT hSeq;
  LOGGER_LOG l;
  UINT32 MaxInputBuffer;
  UINT32 sigSize;
  TPM_ALG_ID idKeyHashAlg;
  TPM2B_DIGEST digest;
  TPM_RC rc;
  UINT32 result;
  UINT32 sigBufSize_local;
  BYTE *signatureBuffer_local;
  BYTE *pBStack_20;
  UINT32 tokenSize_local;
  BYTE *tokenData_local;
  TSS_SESSION *sess_local;
  TSS_DEVICE *tpm_local;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  MaxInputBuffer._0_2_ = 0xb;
  rc = sigBufSize;
  _result = signatureBuffer;
  signatureBuffer_local._4_4_ = tokenSize;
  pBStack_20 = tokenData;
  tokenData_local = (BYTE *)sess;
  sess_local = (TSS_SESSION *)tpm;
  UVar2 = TSS_GetDigestSize(0xb);
  l._4_4_ = (uint)UVar2;
  l._0_4_ = 0;
  if (rc < l._4_4_) {
    p_Stack_90 = xlogging_get_log_function();
    if (p_Stack_90 != (LOGGER_LOG)0x0) {
      (*p_Stack_90)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                    ,"SignData",0x139,1,
                    "Signature buffer size (%uz) is less than required size (%uz)",
                    CONCAT44(uVar5,rc),l._4_4_);
    }
    digest._62_4_ = l._4_4_;
  }
  else {
    rc = 0;
    l._0_4_ = TSS_GetTpmProperty((TSS_DEVICE *)sess_local,0x10d);
    if ((UINT32)l < signatureBuffer_local._4_4_) {
      curPos._4_4_ = 0x40000007;
      pBStack_a0 = pBStack_20;
      l_1._4_4_ = signatureBuffer_local._4_4_;
      digest._58_4_ =
           TPM2_HMAC_Start((TSS_DEVICE *)sess_local,(TSS_SESSION *)tokenData_local,0x81000100,
                           (TPM2B_AUTH *)0x0,(TPMI_ALG_HASH)MaxInputBuffer,
                           (TPMI_DH_OBJECT *)((long)&curPos + 4));
      if (digest._58_4_ == 0) {
        bVar1 = true;
        do {
          digest._58_4_ = 0;
          digest._58_4_ =
               TSS_SequenceUpdate((TSS_DEVICE *)sess_local,(TSS_SESSION *)tokenData_local,
                                  curPos._4_4_,pBStack_a0,(UINT32)l);
          if (digest._58_4_ != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = TSS_StatusValueName(digest._58_4_);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                        ,"SignData",0x156,1,"Failed to update HMAC sequence %s",pcVar4);
            }
            bVar1 = false;
            break;
          }
          l_1._4_4_ = l_1._4_4_ - (UINT32)l;
          pBStack_a0 = pBStack_a0 + (UINT32)l;
        } while ((UINT32)l < l_1._4_4_);
        if (bVar1) {
          digest._58_4_ =
               TSS_SequenceComplete
                         ((TSS_DEVICE *)sess_local,(TSS_SESSION *)tokenData_local,curPos._4_4_,
                          pBStack_a0,l_1._4_4_,(TPM2B_DIGEST *)((long)&MaxInputBuffer + 2));
          if (digest._58_4_ == 0) {
            MemoryCopy(_result,&sigSize,l._4_4_);
            digest._62_4_ = l._4_4_;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = TSS_StatusValueName(digest._58_4_);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                        ,"SignData",0x164,1,"Failed to complete HMAC sequence %s",pcVar4);
            }
            digest._62_4_ = 0;
          }
        }
        else {
          digest._62_4_ = 0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar4 = TSS_StatusValueName(digest._58_4_);
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                    ,"SignData",0x149,1,"Failed to start HMAC sequence %s",pcVar4);
        }
        digest._62_4_ = 0;
      }
    }
    else {
      digest._58_4_ =
           TSS_HMAC((TSS_DEVICE *)sess_local,(TSS_SESSION *)tokenData_local,0x81000100,pBStack_20,
                    signatureBuffer_local._4_4_,(TPM2B_DIGEST *)((long)&MaxInputBuffer + 2));
      if (digest._58_4_ == 0) {
        MemoryCopy(_result,&sigSize,l._4_4_);
        digest._62_4_ = l._4_4_;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar4 = TSS_StatusValueName(digest._58_4_);
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                    ,"SignData",0x179,1,"Hashing token data failed %s",pcVar4);
        }
        digest._62_4_ = 0;
      }
    }
  }
  return digest._62_4_;
}

Assistant:

UINT32 SignData(TSS_DEVICE* tpm, TSS_SESSION* sess, BYTE* tokenData, UINT32 tokenSize, BYTE* signatureBuffer, UINT32 sigBufSize)
{
    UINT32 result;
    TPM_RC          rc;
    TPM2B_DIGEST    digest;
    TPM_ALG_ID      idKeyHashAlg = ALG_SHA256_VALUE;
    UINT32          sigSize = TSS_GetDigestSize(idKeyHashAlg); //32
    UINT32          MaxInputBuffer = 0;

    if (sigBufSize < sigSize)
    {
        LogError("Signature buffer size (%uz) is less than required size (%uz)", sigBufSize, sigSize);
        result = sigSize;
    }
    else
    {
        sigBufSize = 0;
        MaxInputBuffer = TSS_GetTpmProperty(tpm, TPM_PT_INPUT_BUFFER); // 1024
        if (tokenSize > MaxInputBuffer) // 68
        {
            TPMI_DH_OBJECT  hSeq = TPM_RH_NULL;
            BYTE           *curPos = tokenData;
            UINT32          bytesLeft = tokenSize;

            rc = TPM2_HMAC_Start(tpm, sess, DPS_ID_KEY_HANDLE, NULL, idKeyHashAlg, &hSeq);
            if (rc != TPM_RC_SUCCESS)
            {
                LogError("Failed to start HMAC sequence %s", TSS_StatusValueName(rc) );
                result = 0;
            }
            else
            {
                bool seq_complete = true;
                // Above condition 'if (tokenSize > MaxInputBuffer)' ensures that the first
                // iteration is always valid.
                do
                {
                    rc = TSS_SequenceUpdate(tpm, sess, hSeq, curPos, MaxInputBuffer);
                    if (rc != TPM_RC_SUCCESS)
                    {
                        LogError("Failed to update HMAC sequence %s", TSS_StatusValueName(rc));
                        seq_complete = false;
                        break;
                    }

                    bytesLeft -= MaxInputBuffer;
                    curPos += MaxInputBuffer;
                } while (bytesLeft > MaxInputBuffer);

                if (seq_complete)
                {
                    rc = TSS_SequenceComplete(tpm, sess, hSeq, curPos, bytesLeft, &digest);
                    if (rc != TPM_RC_SUCCESS)
                    {
                        LogError("Failed to complete HMAC sequence %s", TSS_StatusValueName(rc));
                        result = 0;
                    }
                    else
                    {
                        MemoryCopy(signatureBuffer, digest.t.buffer, sigSize);
                        sigBufSize = sigSize;
                        result = sigBufSize;
                    }
                }
                else
                {
                    result = 0;
                }
            }
        }
        else
        {
            rc = TSS_HMAC(tpm, sess, DPS_ID_KEY_HANDLE, tokenData, tokenSize, &digest);
            if (rc != TPM_RC_SUCCESS)
            {
                LogError("Hashing token data failed %s", TSS_StatusValueName(rc));
                result = 0;
            }
            else
            {
                MemoryCopy(signatureBuffer, digest.t.buffer, sigSize);
                sigBufSize = sigSize;
                result = sigBufSize;
            }
        }
    }
    return result;
}